

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::getLeakFrom
          (MemoryLeakDetectorList *this,MemoryLeakDetectorNode *node,MemLeakPeriod period)

{
  bool bVar1;
  MemLeakPeriod in_EDX;
  MemoryLeakDetectorNode *in_RSI;
  MemoryLeakDetectorList *in_RDI;
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *local_28;
  
  local_28 = in_RSI;
  while( true ) {
    if (local_28 == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    bVar1 = isInPeriod(in_RDI,local_28,in_EDX);
    if (bVar1) break;
    local_28 = *(MemoryLeakDetectorNode **)(local_28 + 0x38);
  }
  return local_28;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::getLeakFrom(MemoryLeakDetectorNode* node, MemLeakPeriod period)
{
    for (MemoryLeakDetectorNode* cur = node; cur; cur = cur->next_)
        if (isInPeriod(cur, period)) return cur;
    return NULLPTR;
}